

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_chatclient.cpp
# Opt level: O3

void ChatClient::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  code *pcVar2;
  long lVar3;
  undefined8 *puVar4;
  int iVar5;
  undefined4 local_1c;
  void *local_18;
  undefined4 *local_10;
  void *pvStack_8;
  
  if (_c == RegisterMethodArgumentMetaType) {
    if (_id == 5) {
      puVar4 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        *puVar4 = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractSocket::SocketError>::metaType;
        return;
      }
    }
    else {
      puVar4 = (undefined8 *)*_a;
    }
    *puVar4 = 0;
    return;
  }
  if (_c == IndexOfMethod) {
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == connected && lVar3 == 0) {
      *puVar1 = 0;
      return;
    }
    if (pcVar2 == loggedIn && lVar3 == 0) {
      *puVar1 = 1;
      return;
    }
    if (pcVar2 == loginError && lVar3 == 0) {
      *puVar1 = 2;
      return;
    }
    if (pcVar2 == disconnected && lVar3 == 0) {
      *puVar1 = 3;
      return;
    }
    if (pcVar2 == messageReceived && lVar3 == 0) {
      *puVar1 = 4;
      return;
    }
    if (pcVar2 == error && lVar3 == 0) {
      *puVar1 = 5;
      return;
    }
    if (pcVar2 == userJoined && lVar3 == 0) {
      *puVar1 = 6;
      return;
    }
    if (pcVar2 != userLeft || lVar3 != 0) {
      return;
    }
    *puVar1 = 7;
    return;
  }
  if (_c != InvokeMetaMethod) {
    return;
  }
  switch(_id) {
  case 0:
    iVar5 = 0;
    goto LAB_00105bdc;
  case 1:
    iVar5 = 1;
    goto LAB_00105bdc;
  case 2:
    local_10 = (undefined4 *)_a[1];
    iVar5 = 2;
    break;
  case 3:
    iVar5 = 3;
LAB_00105bdc:
    QMetaObject::activate(_o,&staticMetaObject,iVar5,(void **)0x0);
    return;
  case 4:
    local_10 = (undefined4 *)_a[1];
    pvStack_8 = _a[2];
    iVar5 = 4;
    break;
  case 5:
    local_1c = *_a[1];
    local_10 = &local_1c;
    iVar5 = 5;
    break;
  case 6:
    local_10 = (undefined4 *)_a[1];
    iVar5 = 6;
    break;
  case 7:
    local_10 = (undefined4 *)_a[1];
    iVar5 = 7;
    break;
  case 8:
    connectToServer((ChatClient *)_o,(QHostAddress *)_a[1],*_a[2]);
    return;
  case 9:
    login((ChatClient *)_o,(QString *)_a[1]);
    return;
  case 10:
    sendMessage((ChatClient *)_o,(QString *)_a[1]);
    return;
  case 0xb:
    disconnectFromHost((ChatClient *)_o);
    return;
  case 0xc:
    onReadyRead((ChatClient *)_o);
    return;
  default:
    goto switchD_00105a7b_default;
  }
  local_18 = (void *)0x0;
  QMetaObject::activate(_o,&staticMetaObject,iVar5,&local_18);
switchD_00105a7b_default:
  return;
}

Assistant:

void ChatClient::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<ChatClient *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->connected(); break;
        case 1: _t->loggedIn(); break;
        case 2: _t->loginError((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 3: _t->disconnected(); break;
        case 4: _t->messageReceived((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 5: _t->error((*reinterpret_cast< std::add_pointer_t<QAbstractSocket::SocketError>>(_a[1]))); break;
        case 6: _t->userJoined((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 7: _t->userLeft((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 8: _t->connectToServer((*reinterpret_cast< std::add_pointer_t<QHostAddress>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<quint16>>(_a[2]))); break;
        case 9: _t->login((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 10: _t->sendMessage((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 11: _t->disconnectFromHost(); break;
        case 12: _t->onReadyRead(); break;
        default: ;
        }
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 5:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAbstractSocket::SocketError >(); break;
            }
            break;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (ChatClient::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&ChatClient::connected)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (ChatClient::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&ChatClient::loggedIn)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (ChatClient::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&ChatClient::loginError)) {
                *result = 2;
                return;
            }
        }
        {
            using _t = void (ChatClient::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&ChatClient::disconnected)) {
                *result = 3;
                return;
            }
        }
        {
            using _t = void (ChatClient::*)(const QString & , const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&ChatClient::messageReceived)) {
                *result = 4;
                return;
            }
        }
        {
            using _t = void (ChatClient::*)(QAbstractSocket::SocketError );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&ChatClient::error)) {
                *result = 5;
                return;
            }
        }
        {
            using _t = void (ChatClient::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&ChatClient::userJoined)) {
                *result = 6;
                return;
            }
        }
        {
            using _t = void (ChatClient::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&ChatClient::userLeft)) {
                *result = 7;
                return;
            }
        }
    }
}